

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  int iVar1;
  size_type sVar2;
  size_t sVar3;
  Slice *this_00;
  undefined8 in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  Slice user_limit;
  Slice user_start;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  ValueType in_stack_fffffffffffffed4;
  Slice *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  size_type in_stack_fffffffffffffee8;
  long *plVar5;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [23];
  allocator<char> local_59;
  Slice local_58;
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48;
  Slice::Slice(in_stack_fffffffffffffed8,
               (string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  local_48._16_16_ = (undefined1  [16])ExtractUserKey(in_stack_fffffffffffffed8);
  local_58 = ExtractUserKey(in_stack_fffffffffffffed8);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 0x10);
  Slice::data((Slice *)in_stack_fffffffffffffec8);
  Slice::size((Slice *)in_stack_fffffffffffffec8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::allocator<char>::~allocator(&local_59);
  (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_28,&local_58);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_fffffffffffffec8);
  sVar3 = Slice::size((Slice *)in_stack_fffffffffffffec8);
  bVar4 = false;
  if (sVar2 < sVar3) {
    plVar5 = (long *)in_RDI[1];
    Slice::Slice(in_stack_fffffffffffffed8,
                 (string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    iVar1 = (**(code **)(*plVar5 + 0x10))(plVar5,local_48 + 0x10,local_70);
    bVar4 = iVar1 < 0;
  }
  if (bVar4) {
    this_00 = (Slice *)PackSequenceAndType((uint64_t)in_stack_fffffffffffffed8,
                                           in_stack_fffffffffffffed4);
    PutFixed64((string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (uint64_t)in_stack_fffffffffffffec8);
    Slice::Slice(this_00,(string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    Slice::Slice(this_00,(string *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_80,local_90);
    if (-1 < iVar1) {
      __assert_fail("this->Compare(*start, tmp) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.cc"
                    ,0x4f,
                    "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                   );
    }
    Slice::Slice(this_00,(string *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
    iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,local_a0,in_RDX);
    if (-1 < iVar1) {
      __assert_fail("this->Compare(tmp, limit) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.cc"
                    ,0x50,
                    "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
              (this_01,__s);
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(std::string* start,
                                                  const Slice& limit) const {
  // Attempt to shorten the user portion of the key
  Slice user_start = ExtractUserKey(*start);
  Slice user_limit = ExtractUserKey(limit);
  std::string tmp(user_start.data(), user_start.size());
  user_comparator_->FindShortestSeparator(&tmp, user_limit);
  if (tmp.size() < user_start.size() &&
      user_comparator_->Compare(user_start, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*start, tmp) < 0);
    assert(this->Compare(tmp, limit) < 0);
    start->swap(tmp);
  }
}